

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctxt,xmlChar *URL,xmlChar *ID,xmlNodePtr *listOut)

{
  int iVar1;
  xmlParserInputPtr input;
  xmlNodePtr cur;
  
  if (listOut != (xmlNodePtr *)0x0) {
    *listOut = (xmlNodePtr)0x0;
  }
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    iVar1 = 0x73;
  }
  else {
    input = xmlLoadResource(ctxt,(char *)URL,(char *)ID,XML_RESOURCE_GENERAL_ENTITY);
    if (input != (xmlParserInputPtr)0x0) {
      xmlCtxtInitializeLate(ctxt);
      cur = xmlCtxtParseContentInternal(ctxt,input,1,1);
      if (listOut == (xmlNodePtr *)0x0) {
        xmlFreeNodeList(cur);
      }
      else {
        *listOut = cur;
      }
      xmlFreeInputStream(input);
    }
    iVar1 = ctxt->errNo;
  }
  return iVar1;
}

Assistant:

int
xmlParseCtxtExternalEntity(xmlParserCtxtPtr ctxt, const xmlChar *URL,
                           const xmlChar *ID, xmlNodePtr *listOut) {
    xmlParserInputPtr input;
    xmlNodePtr list;

    if (listOut != NULL)
        *listOut = NULL;

    if (ctxt == NULL)
        return(XML_ERR_ARGUMENT);

    input = xmlLoadResource(ctxt, (char *) URL, (char *) ID,
                            XML_RESOURCE_GENERAL_ENTITY);
    if (input == NULL)
        return(ctxt->errNo);

    xmlCtxtInitializeLate(ctxt);

    list = xmlCtxtParseContentInternal(ctxt, input, /* hasTextDecl */ 1, 1);
    if (listOut != NULL)
        *listOut = list;
    else
        xmlFreeNodeList(list);

    xmlFreeInputStream(input);
    return(ctxt->errNo);
}